

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::ClipperOffset::DoMiter(ClipperOffset *this,int j,int k,double r)

{
  double dVar1;
  long lVar2;
  reference pvVar3;
  reference pvVar4;
  cInt x;
  cInt y;
  IntPoint local_38;
  double local_28;
  double q;
  double r_local;
  int k_local;
  int j_local;
  ClipperOffset *this_local;
  
  local_28 = this->m_delta / r;
  q = r;
  r_local._0_4_ = k;
  r_local._4_4_ = j;
  _k_local = this;
  pvVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     (&this->m_srcPoly,(long)j);
  lVar2 = pvVar3->X;
  pvVar4 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)r_local._0_4_);
  dVar1 = pvVar4->X;
  pvVar4 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)r_local._4_4_);
  x = Round((dVar1 + pvVar4->X) * local_28 + (double)lVar2);
  pvVar3 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     (&this->m_srcPoly,(long)r_local._4_4_);
  lVar2 = pvVar3->Y;
  pvVar4 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)r_local._0_4_);
  dVar1 = pvVar4->Y;
  pvVar4 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)r_local._4_4_);
  y = Round((dVar1 + pvVar4->Y) * local_28 + (double)lVar2);
  IntPoint::IntPoint(&local_38,x,y);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
            (&this->m_destPoly,&local_38);
  return;
}

Assistant:

void ClipperOffset::DoMiter(int j, int k, double r)
{
  double q = m_delta / r;
  m_destPoly.push_back(IntPoint(Round(m_srcPoly[j].X + (m_normals[k].X + m_normals[j].X) * q),
      Round(m_srcPoly[j].Y + (m_normals[k].Y + m_normals[j].Y) * q)));
}